

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

bool __thiscall
sentencepiece::string_util::lexical_cast<bool>(string_util *this,string_view arg,bool *result)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  size_type sVar6;
  long lVar7;
  string lower_value;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_40._M_str = (char *)arg._M_len;
  local_40._M_len = (size_t)this;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&local_60,&local_40,&local_61);
  for (sVar6 = 0; local_60._M_string_length != sVar6; sVar6 = sVar6 + 1) {
    iVar4 = tolower((int)local_60._M_dataplus._M_p[sVar6]);
    local_60._M_dataplus._M_p[sVar6] = (char)iVar4;
  }
  lVar7 = 0;
  uVar1 = 0;
  do {
    uVar5 = uVar1;
    if (uVar5 == 5) goto LAB_0020982d;
    bVar2 = std::operator==(&local_60,
                            (char *)((long)&DAT_0027bb8c +
                                    (long)*(int *)((long)&DAT_0027bb8c + lVar7)));
    if (bVar2) {
      cVar3 = '\x01';
      goto LAB_0020982b;
    }
    bVar2 = std::operator==(&local_60,
                            (char *)((long)&DAT_0027bba0 +
                                    (long)*(int *)((long)&DAT_0027bba0 + lVar7)));
    lVar7 = lVar7 + 4;
    uVar1 = uVar5 + 1;
  } while (!bVar2);
  cVar3 = '\0';
LAB_0020982b:
  *arg._M_str = cVar3;
LAB_0020982d:
  std::__cxx11::string::~string((string *)&local_60);
  return uVar5 < 5;
}

Assistant:

inline bool lexical_cast(absl::string_view arg, bool *result) {
  const char *kTrue[] = {"1", "t", "true", "y", "yes"};
  const char *kFalse[] = {"0", "f", "false", "n", "no"};
  std::string lower_value = std::string(arg);
  std::transform(lower_value.begin(), lower_value.end(), lower_value.begin(),
                 ::tolower);
  for (size_t i = 0; i < 5; ++i) {
    if (lower_value == kTrue[i]) {
      *result = true;
      return true;
    } else if (lower_value == kFalse[i]) {
      *result = false;
      return true;
    }
  }

  return false;
}